

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O3

void run_test(void)

{
  char cVar1;
  _Bool _Var2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  bool bVar5;
  undefined1 auStack_41c90 [8];
  automaton a;
  char buffer [2000];
  char local_824 [1004];
  char local_438 [8];
  char boolstr [2] [100];
  char local_4a [8];
  char expected_ans_tmp [10];
  _Bool local_31 [8];
  _Bool err;
  
  local_31[0] = false;
  load_automaton((automaton *)auStack_41c90,local_31);
  pcVar3 = fgets(a.transitions[0xa41] + 0x5d,2000,_stdin);
  if (pcVar3 == (char *)0x0) {
    expected_ans_tmp[2] = '\0';
    expected_ans_tmp[3] = '\0';
    expected_ans_tmp[4] = '\0';
    expected_ans_tmp[5] = '\0';
    expected_ans_tmp[6] = '\0';
    expected_ans_tmp[7] = '\0';
    expected_ans_tmp[8] = '\0';
    expected_ans_tmp[9] = '\0';
  }
  else {
    expected_ans_tmp[2] = '\0';
    expected_ans_tmp[3] = '\0';
    expected_ans_tmp[4] = '\0';
    expected_ans_tmp[5] = '\0';
    expected_ans_tmp[6] = '\0';
    expected_ans_tmp[7] = '\0';
    expected_ans_tmp[8] = '\0';
    expected_ans_tmp[9] = '\0';
    do {
      __s = a.transitions[0xa41] + 0x5d;
      sVar4 = strlen(__s);
      __s[sVar4 - 1] = '\0';
      pcVar3 = fgets(local_4a,10,_stdin);
      cVar1 = local_4a[0];
      local_31[0] = pcVar3 == (char *)0x0;
      bVar5 = local_4a[0] != '0';
      getpid();
      memset(local_824,0,0x3e9);
      sVar4 = strlen(__s);
      memcpy(local_824,__s,sVar4);
      printf("Validating processed word: %s\n",local_824);
      local_438[0] = (char)a.universal_states_size;
      local_438[1] = 0;
      _Var2 = accept_rec((automaton *)auStack_41c90,local_824,local_438);
      if (bVar5 == _Var2) {
        printf("PASSED: %s\n",local_824);
      }
      else {
        expected_ans_tmp._2_8_ = expected_ans_tmp._2_8_ + 1;
        printf("FAILED TEST: %s - ",local_824);
        memcpy(local_438,"false",200);
        printf("got %s instead of %s. \n",boolstr[(ulong)_Var2 - 1] + 0x5c,
               boolstr[(ulong)(cVar1 != '0') - 1] + 0x5c);
      }
      putchar(10);
      a.transitions[0xa41][0x5d] = '\0';
      pcVar3 = fgets(a.transitions[0xa41] + 0x5d,2000,_stdin);
    } while (pcVar3 != (char *)0x0);
  }
  printf("Finished, # of failed cases: %zu.\n",expected_ans_tmp._2_8_);
  return;
}

Assistant:

void run_test() {
    automaton a;
    size_t failed = 0;
    bool err = false;
    void *tmp_err;
    load_automaton(&a, &err);

    char buffer[2*WORD_LEN_MAX]; // + '\n' and '\0'
    while(fgets(buffer, sizeof(buffer), stdin)) {
        assert(strlen(buffer) < WORD_LEN_MAX +2);
        assert(buffer[strlen(buffer)-1] == '\n');
        buffer[strlen(buffer)-1] = '\0';

        // load answer for loaded word
        char expected_ans_tmp[10];
        tmp_err = fgets(expected_ans_tmp, 10, stdin);
        err = (tmp_err == NULL);
        bool expected_ans = (bool)(expected_ans_tmp[0]-'0');
        assert(expected_ans==true || expected_ans == false);

        // testing if validator mq holds enough data
        validator_mq_msg test_msg = {false, false, false, true, false, getpid(), ""};
        memcpy(test_msg.word, buffer, strlen(buffer));
        printf("Validating processed word: %s\n", test_msg.word);

        // testing validation result
        bool ans = accept(&a, test_msg.word);
        if(ans != expected_ans) {
            failed++;
            printf("FAILED TEST: %s - ", test_msg.word);
            char boolstr[2][100] = {"false", "true"};
            printf("got %s instead of %s. \n", boolstr[ans], boolstr[expected_ans]);
        } else {
            printf("PASSED: %s\n", test_msg.word);
        }
        printf("\n");
        buffer[0] = '\0';
    }
    printf("Finished, # of failed cases: %zu.\n", failed);
}